

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O0

char ** Abc_NtkCollectCioNames(Abc_Ntk_t *pNtk,int fCollectCos)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  int local_2c;
  char **ppcStack_28;
  int i;
  char **ppNames;
  Abc_Obj_t *pObj;
  int fCollectCos_local;
  Abc_Ntk_t *pNtk_local;
  
  if (fCollectCos == 0) {
    iVar1 = Abc_NtkCiNum(pNtk);
    ppcStack_28 = (char **)malloc((long)iVar1 << 3);
    for (local_2c = 0; iVar1 = Abc_NtkCiNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
      pAVar2 = Abc_NtkCi(pNtk,local_2c);
      pcVar3 = Abc_ObjName(pAVar2);
      ppcStack_28[local_2c] = pcVar3;
    }
  }
  else {
    iVar1 = Abc_NtkCoNum(pNtk);
    ppcStack_28 = (char **)malloc((long)iVar1 << 3);
    for (local_2c = 0; iVar1 = Abc_NtkCoNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
      pAVar2 = Abc_NtkCo(pNtk,local_2c);
      pcVar3 = Abc_ObjName(pAVar2);
      ppcStack_28[local_2c] = pcVar3;
    }
  }
  return ppcStack_28;
}

Assistant:

char ** Abc_NtkCollectCioNames( Abc_Ntk_t * pNtk, int fCollectCos )
{
    Abc_Obj_t * pObj;
    char ** ppNames;
    int i;
    if ( fCollectCos )
    {
        ppNames = ABC_ALLOC( char *, Abc_NtkCoNum(pNtk) );
        Abc_NtkForEachCo( pNtk, pObj, i )
            ppNames[i] = Abc_ObjName(pObj);
    }
    else
    {
        ppNames = ABC_ALLOC( char *, Abc_NtkCiNum(pNtk) );
        Abc_NtkForEachCi( pNtk, pObj, i )
            ppNames[i] = Abc_ObjName(pObj);
    }
    return ppNames;
}